

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O0

void __thiscall OpenMD::DumpReader::parseSiteLine(DumpReader *this,string *line)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  long *plVar4;
  size_t sVar5;
  reference ppAVar6;
  undefined1 *puVar7;
  double *pdVar8;
  long in_RDI;
  RealType RVar9;
  _func_int **pp_Var10;
  RealType dens;
  RealType sPot;
  Vector3d eField;
  RealType flucQFrc;
  RealType flucQVel;
  RealType flucQPos;
  RealType particlePot;
  int i_1;
  int size;
  string type;
  RigidBody *rb;
  int siteIndex;
  istringstream i;
  string indexTest;
  StuntDouble *sd;
  int index;
  int nTokens;
  StringTokenizer tokenizer;
  RigidBody *in_stack_fffffffffffffbd8;
  errorStruct *peVar11;
  StringTokenizer *in_stack_fffffffffffffbe0;
  SimInfo *in_stack_fffffffffffffbe8;
  StuntDouble *in_stack_fffffffffffffbf0;
  StringTokenizer *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  Vector<double,_3U> local_2e0;
  RealType local_2c8;
  RealType local_2c0;
  RealType local_2b8;
  RealType local_2b0;
  int local_2a8;
  int local_2a4;
  string local_2a0 [32];
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_280;
  value_type local_268;
  int local_25c;
  istringstream local_258 [384];
  string local_d8 [36];
  undefined4 local_b4;
  value_type local_b0;
  int local_a4;
  int local_a0;
  allocator<char> local_89;
  string local_88 [136];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             (char *)in_stack_fffffffffffffc18,(allocator<char> *)in_stack_fffffffffffffc10);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  local_a0 = StringTokenizer::countTokens((StringTokenizer *)in_stack_fffffffffffffbf0);
  if (local_a0 < 1) {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",uVar3);
    painCave.isFatal = 1;
    simError();
  }
  local_a4 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffc00);
  local_b0 = (value_type)
             SimInfo::getIOIndexToIntegrableObject
                       (in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
  if (local_b0 == (value_type)0x0) {
    local_b4 = 1;
    goto LAB_001e4b6f;
  }
  if (local_a0 == 1) {
    local_b4 = 1;
    goto LAB_001e4b6f;
  }
  StringTokenizer::peekNextToken_abi_cxx11_
            ((StringTokenizer *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  std::__cxx11::istringstream::istringstream(local_258,local_d8,_S_in);
  plVar4 = (long *)std::istream::operator>>(local_258,&local_25c);
  bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if (bVar2) {
    local_25c = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffc00);
    bVar2 = StuntDouble::isRigidBody(&local_b0->super_StuntDouble);
    iVar1 = local_25c;
    if (!bVar2) goto LAB_001e45fa;
    local_268 = local_b0;
    sVar5 = RigidBody::getNumAtoms((RigidBody *)0x1e4555);
    if (iVar1 < (int)sVar5) {
      RigidBody::getAtoms(in_stack_fffffffffffffbd8);
      ppAVar6 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                          (&local_280,(long)local_25c);
      local_b0 = *ppAVar6;
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 in_stack_fffffffffffffbf0);
      goto LAB_001e45fa;
    }
    local_b4 = 1;
  }
  else {
LAB_001e45fa:
    StringTokenizer::nextToken_abi_cxx11_
              ((StringTokenizer *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    local_2a4 = std::__cxx11::string::size();
    for (local_2a8 = 0; local_2a8 < local_2a4; local_2a8 = local_2a8 + 1) {
      puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_2a0);
      switch(*puVar7) {
      case 99:
        local_2b8 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        bVar2 = StuntDouble::isAtom(&local_b0->super_StuntDouble);
        if (bVar2) {
          if (local_b0 != (value_type)0x0) {
            __dynamic_cast(local_b0,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          }
          bVar2 = Atom::isFluctuatingCharge((Atom *)0x1e47b0);
          if (bVar2) {
            StuntDouble::setFlucQPos(in_stack_fffffffffffffbf0,(RealType)in_stack_fffffffffffffbe8);
          }
        }
        break;
      case 100:
        in_stack_fffffffffffffbe0 =
             (StringTokenizer *)
             StringTokenizer::nextTokenAsDouble
                       ((StringTokenizer *)
                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        StuntDouble::setDensity(in_stack_fffffffffffffbf0,(RealType)in_stack_fffffffffffffbe8);
        break;
      case 0x65:
        Vector3<double>::Vector3((Vector3<double> *)0x1e497c);
        RVar9 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        pdVar8 = Vector<double,_3U>::operator[](&local_2e0,0);
        *pdVar8 = RVar9;
        RVar9 = StringTokenizer::nextTokenAsDouble
                          ((StringTokenizer *)
                           CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        pdVar8 = Vector<double,_3U>::operator[](&local_2e0,1);
        *pdVar8 = RVar9;
        pp_Var10 = (_func_int **)
                   StringTokenizer::nextTokenAsDouble
                             ((StringTokenizer *)
                              CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        in_stack_fffffffffffffbf0 = (StuntDouble *)Vector<double,_3U>::operator[](&local_2e0,2);
        in_stack_fffffffffffffbf0->_vptr_StuntDouble = pp_Var10;
        if ((*(byte *)(in_RDI + 0x255) & 1) != 0) {
          StuntDouble::setElectricField
                    (in_stack_fffffffffffffbf0,(Vector3d *)in_stack_fffffffffffffbe8);
        }
        break;
      default:
        uVar3 = std::__cxx11::string::c_str();
        peVar11 = &painCave;
        snprintf(painCave.errMsg,2000,"DumpReader Error: %s is an unrecognized type\n",uVar3);
        peVar11->isFatal = 1;
        simError();
        break;
      case 0x67:
        local_2c8 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        bVar2 = StuntDouble::isAtom(&local_b0->super_StuntDouble);
        if (bVar2) {
          if (local_b0 != (value_type)0x0) {
            __dynamic_cast(local_b0,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          }
          in_stack_fffffffffffffc27 = Atom::isFluctuatingCharge((Atom *)0x1e493e);
          if ((bool)in_stack_fffffffffffffc27) {
            StuntDouble::setFlucQFrc(in_stack_fffffffffffffbf0,(RealType)in_stack_fffffffffffffbe8);
          }
        }
        break;
      case 0x73:
        in_stack_fffffffffffffbe8 =
             (SimInfo *)
             StringTokenizer::nextTokenAsDouble
                       ((StringTokenizer *)
                        CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        StuntDouble::setSitePotential(in_stack_fffffffffffffbf0,(RealType)in_stack_fffffffffffffbe8)
        ;
        break;
      case 0x75:
        local_2b0 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        StuntDouble::setParticlePot(in_stack_fffffffffffffbf0,(RealType *)in_stack_fffffffffffffbe8)
        ;
        break;
      case 0x77:
        local_2c0 = StringTokenizer::nextTokenAsDouble
                              ((StringTokenizer *)
                               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        bVar2 = StuntDouble::isAtom(&local_b0->super_StuntDouble);
        if (bVar2) {
          if (local_b0 != (value_type)0x0) {
            __dynamic_cast(local_b0,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          }
          bVar2 = Atom::isFluctuatingCharge((Atom *)0x1e4883);
          if (bVar2) {
            StuntDouble::setFlucQVel(in_stack_fffffffffffffbf0,(RealType)in_stack_fffffffffffffbe8);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_2a0);
    local_b4 = 0;
  }
  std::__cxx11::istringstream::~istringstream(local_258);
  std::__cxx11::string::~string(local_d8);
LAB_001e4b6f:
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffbe0);
  return;
}

Assistant:

void DumpReader::parseSiteLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 1) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    /**
     * The first token is the global integrable object index.
     */

    int index       = tokenizer.nextTokenAsInt();
    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);
    if (sd == NULL) { return; }

    // StuntDoubles have a line even if there is nothing stored in the
    // site data:
    if (nTokens == 1) { return; }

    /**
     * Test to see if the next token is an integer or not.  If not,
     * we've got data on the integrable object itself.  If there is an
     * integer, we're parsing data for a site on a rigid body.
     */
    std::string indexTest = tokenizer.peekNextToken();
    std::istringstream i(indexTest);
    int siteIndex;
    if (i >> siteIndex) {
      // chew up this token and parse as an int:
      siteIndex = tokenizer.nextTokenAsInt();
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);

        // Sometimes site lines are inherited from other models, so
        // just ignore a site line that exceeds the number of atoms in
        // our RB:
        if (siteIndex >= static_cast<int>(rb->getNumAtoms())) { return; }

        sd = rb->getAtoms()[siteIndex];
      }
    }

    /**
     * The next token contains information on what follows.
     */
    std::string type = tokenizer.nextToken();
    int size         = type.size();

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'u': {
        RealType particlePot;
        particlePot = tokenizer.nextTokenAsDouble();
        sd->setParticlePot(particlePot);
        break;
      }
      case 'c': {
        RealType flucQPos;
        flucQPos = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQPos(flucQPos);
        break;
      }
      case 'w': {
        RealType flucQVel;
        flucQVel = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQVel(flucQVel);
        break;
      }
      case 'g': {
        RealType flucQFrc;
        flucQFrc = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQFrc(flucQFrc);
        break;
      }
      case 'e': {
        Vector3d eField;
        eField[0] = tokenizer.nextTokenAsDouble();
        eField[1] = tokenizer.nextTokenAsDouble();
        eField[2] = tokenizer.nextTokenAsDouble();
        if (readField_) sd->setElectricField(eField);
        break;
      }
      case 's': {
        RealType sPot;
        sPot = tokenizer.nextTokenAsDouble();
        sd->setSitePotential(sPot);
        break;
      }
      case 'd': {
        RealType dens;
        dens = tokenizer.nextTokenAsDouble();
        sd->setDensity(dens);
        break;
      }
      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
    }
  }